

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDatatypeValidator.cpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::TimeDatatypeValidator::getCanonicalRepresentation
          (TimeDatatypeValidator *this,XMLCh *rawData,MemoryManager *memMgr,bool toValidate)

{
  XMLCh *pXVar1;
  undefined7 in_register_00000009;
  XMLDateTime aDateTime;
  XMLDateTime XStack_78;
  
  if (memMgr == (MemoryManager *)0x0) {
    memMgr = (this->super_DateTimeValidator).super_AbstractNumericFacetValidator.
             super_DatatypeValidator.fMemoryManager;
  }
  if ((int)CONCAT71(in_register_00000009,toValidate) != 0) {
    (*(this->super_DateTimeValidator).super_AbstractNumericFacetValidator.super_DatatypeValidator.
      super_XSerializable._vptr_XSerializable[0x11])(this,rawData,0,0,memMgr);
  }
  XMLDateTime::XMLDateTime(&XStack_78,rawData,memMgr);
  XMLDateTime::parseTime(&XStack_78);
  pXVar1 = XMLDateTime::getTimeCanonicalRepresentation(&XStack_78,memMgr);
  XMLDateTime::~XMLDateTime(&XStack_78);
  return pXVar1;
}

Assistant:

const XMLCh* TimeDatatypeValidator::getCanonicalRepresentation(const XMLCh*         const rawData
                                                              ,      MemoryManager* const memMgr
                                                              ,      bool                 toValidate) const
{
    MemoryManager* toUse = memMgr? memMgr : fMemoryManager;

    if (toValidate)
    {
        TimeDatatypeValidator* temp = (TimeDatatypeValidator*) this;

        try
        {
            temp->checkContent(rawData, 0, false, toUse);   
        }
        catch (...)
        {
            return 0;
        }
    }
    
    try
    {
        XMLDateTime aDateTime(rawData, toUse);
        aDateTime.parseTime();
        return aDateTime.getTimeCanonicalRepresentation(toUse);
    }
    catch (...)
    {
        return 0;
    }

}